

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonIterativeFeaturePreservingMeshFiltering.cpp
# Opt level: O0

void __thiscall
NonIterativeFeaturePreservingMeshFiltering::mollifiedNormals
          (NonIterativeFeaturePreservingMeshFiltering *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *face_centroid,vector<double,_std::allocator<double>_> *face_area,double sigma_f,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *mollified_normals)

{
  undefined8 uVar1;
  bool bVar2;
  uint _i;
  int iVar3;
  VertexHandle _vh;
  reference pvVar4;
  Point *pPVar5;
  reference pvVar6;
  size_type sVar7;
  reference pvVar8;
  Normal *pNVar9;
  BaseHandle *pBVar10;
  reference pvVar11;
  VertexIter VVar12;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
  GVar13;
  FaceIter FVar14;
  FaceIter local_3c8;
  undefined1 local_3b8 [8];
  FaceIter f_it;
  VertexHandle vh;
  int vertex_index;
  vector_type local_370;
  value_type local_358;
  double area;
  double weight;
  double local_330;
  double dis;
  Point centroid;
  int local_304;
  double dStack_300;
  int i;
  double weight_sum;
  Point new_point;
  undefined1 local_2d8 [8];
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> vertex_face_neighbor;
  undefined1 auStack_2b8 [8];
  Point pt;
  VertexIter local_298 [2];
  undefined1 local_278 [8];
  VertexIter v_it;
  double sigma_m;
  TriMesh temp_mesh;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  *mollified_normals_local;
  double sigma_f_local;
  vector<double,_std::allocator<double>_> *face_area_local;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  *face_centroid_local;
  TriMesh *mesh_local;
  NonIterativeFeaturePreservingMeshFiltering *this_local;
  
  temp_mesh.super_Mesh.
  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>._544_8_
       = mollified_normals;
  OpenMesh::TriMesh_ArrayKernelT<MyTraits>::TriMesh_ArrayKernelT
            ((TriMesh_ArrayKernelT<MyTraits> *)&sigma_m,mesh);
  v_it._8_8_ = sigma_f * 0.5;
  VVar12 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)mesh);
  while( true ) {
    v_it.mesh_ = VVar12._8_8_;
    local_278 = (undefined1  [8])VVar12.mesh_;
    VVar12 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)mesh);
    local_298[0] = VVar12;
    bVar2 = OpenMesh::Iterators::
            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
            ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                          *)local_278,local_298);
    uVar1 = temp_mesh.super_Mesh.
            super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
            .
            super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
            ._544_8_;
    if (!bVar2) break;
    pvVar4 = OpenMesh::Iterators::
             GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
             ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                          *)local_278);
    vertex_face_neighbor.
    super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = (pvVar4->super_BaseHandle).idx_;
    pPVar5 = OpenMesh::
             AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
             point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                    *)mesh,(VertexHandle)
                           vertex_face_neighbor.
                           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    pt.super_VectorDataT<double,_3>.values_[1] = (pPVar5->super_VectorDataT<double,_3>).values_[2];
    auStack_2b8 = (undefined1  [8])(pPVar5->super_VectorDataT<double,_3>).values_[0];
    pt.super_VectorDataT<double,_3>.values_[0] = (pPVar5->super_VectorDataT<double,_3>).values_[1];
    std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::vector
              ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)local_2d8);
    pvVar4 = OpenMesh::Iterators::
             GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
             ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                          *)local_278);
    new_point.super_VectorDataT<double,_3>.values_[2]._4_4_ = (pvVar4->super_BaseHandle).idx_;
    getVertexFaceNeighbor
              (this,mesh,face_centroid,
               (VertexHandle)new_point.super_VectorDataT<double,_3>.values_[2]._4_4_,sigma_f,
               (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)local_2d8);
    OpenMesh::VectorT<double,_3>::VectorT((VectorT<double,_3> *)&weight_sum,0.0,0.0,0.0);
    dStack_300 = 0.0;
    local_304 = 0;
    while( true ) {
      sVar7 = std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::size
                        ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                         local_2d8);
      if ((int)sVar7 <= local_304) break;
      pBVar10 = &std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
                 operator[]((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                            local_2d8,(long)local_304)->super_BaseHandle;
      iVar3 = OpenMesh::BaseHandle::idx(pBVar10);
      pvVar11 = std::
                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::operator[](face_centroid,(long)iVar3);
      centroid.super_VectorDataT<double,_3>.values_[1] =
           (pvVar11->super_VectorDataT<double,_3>).values_[2];
      dis = (pvVar11->super_VectorDataT<double,_3>).values_[0];
      centroid.super_VectorDataT<double,_3>.values_[0] =
           (pvVar11->super_VectorDataT<double,_3>).values_[1];
      OpenMesh::VectorT<double,_3>::operator-
                ((vector_type *)&weight,(VectorT<double,_3> *)&dis,(vector_type *)auStack_2b8);
      local_330 = OpenMesh::VectorT<double,_3>::length((VectorT<double,_3> *)&weight);
      area = exp((local_330 * -0.5 * local_330) / ((double)v_it._8_8_ * (double)v_it._8_8_));
      pBVar10 = &std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
                 operator[]((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                            local_2d8,(long)local_304)->super_BaseHandle;
      iVar3 = OpenMesh::BaseHandle::idx(pBVar10);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](face_area,(long)iVar3);
      local_358 = *pvVar6;
      OpenMesh::VectorT<double,_3>::operator*
                ((vector_type *)&vh,(VectorT<double,_3> *)&dis,&local_358);
      OpenMesh::VectorT<double,_3>::operator*(&local_370,(VectorT<double,_3> *)&vh,&area);
      OpenMesh::VectorT<double,_3>::operator+=((VectorT<double,_3> *)&weight_sum,&local_370);
      dStack_300 = local_358 * area + dStack_300;
      local_304 = local_304 + 1;
    }
    OpenMesh::VectorT<double,_3>::operator/=
              ((VectorT<double,_3> *)&weight_sum,&stack0xfffffffffffffd00);
    pBVar10 = &OpenMesh::Iterators::
               GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
               ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                            *)local_278)->super_BaseHandle;
    _i = OpenMesh::BaseHandle::idx(pBVar10);
    _vh = OpenMesh::ArrayKernel::vertex_handle((ArrayKernel *)&sigma_m,_i);
    OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
    set_point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *
              )&sigma_m,(VertexHandle)_vh.super_BaseHandle.idx_,(Point *)&weight_sum);
    std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::~vector
              ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)local_2d8);
    GVar13 = OpenMesh::Iterators::
             GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
             ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                           *)local_278,0);
    VVar12._8_8_ = v_it.mesh_;
    VVar12.mesh_ = (mesh_ptr)local_278;
    f_it._8_8_ = GVar13.mesh_;
  }
  sVar7 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x28))();
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            ((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *
             )uVar1,sVar7);
  OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
  request_face_normals
            ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *)
             &sigma_m);
  OpenMesh::
  PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  ::update_face_normals
            ((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              *)&sigma_m);
  FVar14 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)&sigma_m);
  while( true ) {
    f_it.mesh_ = FVar14._8_8_;
    local_3b8 = (undefined1  [8])FVar14.mesh_;
    FVar14 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)&sigma_m);
    local_3c8 = FVar14;
    bVar2 = OpenMesh::Iterators::
            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
            ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          *)local_3b8,&local_3c8);
    if (!bVar2) break;
    pvVar8 = OpenMesh::Iterators::
             GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
             ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          *)local_3b8);
    pNVar9 = OpenMesh::
             AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
             normal((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                     *)&sigma_m,(FaceHandle)(pvVar8->super_BaseHandle).idx_);
    uVar1 = temp_mesh.super_Mesh.
            super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
            .
            super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
            ._544_8_;
    pBVar10 = &OpenMesh::Iterators::
               GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
               ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                            *)local_3b8)->super_BaseHandle;
    iVar3 = OpenMesh::BaseHandle::idx(pBVar10);
    pvVar11 = std::
              vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
              operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)uVar1,(long)iVar3);
    (pvVar11->super_VectorDataT<double,_3>).values_[0] =
         (pNVar9->super_VectorDataT<double,_3>).values_[0];
    (pvVar11->super_VectorDataT<double,_3>).values_[1] =
         (pNVar9->super_VectorDataT<double,_3>).values_[1];
    (pvVar11->super_VectorDataT<double,_3>).values_[2] =
         (pNVar9->super_VectorDataT<double,_3>).values_[2];
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)local_3b8,0);
    FVar14._8_8_ = f_it.mesh_;
    FVar14.mesh_ = (mesh_ptr)local_3b8;
  }
  OpenMesh::TriMesh_ArrayKernelT<MyTraits>::~TriMesh_ArrayKernelT
            ((TriMesh_ArrayKernelT<MyTraits> *)&sigma_m);
  return;
}

Assistant:

void NonIterativeFeaturePreservingMeshFiltering::mollifiedNormals(TriMesh &mesh, std::vector<TriMesh::Point> &face_centroid, std::vector<double> &face_area, double sigma_f,
                                                                  std::vector<TriMesh::Normal> &mollified_normals)
{
    TriMesh temp_mesh = mesh;

    double sigma_m = sigma_f / 2.0;

    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
    {
        TriMesh::Point pt = mesh.point(*v_it);

        std::vector<TriMesh::FaceHandle> vertex_face_neighbor;
        getVertexFaceNeighbor(mesh, face_centroid, *v_it, sigma_f, vertex_face_neighbor);

        TriMesh::Point new_point(0.0, 0.0, 0.0);
        double weight_sum = 0.0;
        for(int i = 0; i < (int)vertex_face_neighbor.size(); i++)
        {
            TriMesh::Point centroid = face_centroid[vertex_face_neighbor[i].idx()];

            double dis = (centroid - pt).length();
            double weight = std::exp(- 0.5 * dis * dis / (sigma_m * sigma_m));

            double area = face_area[vertex_face_neighbor[i].idx()];
            new_point += centroid * area * weight;
            weight_sum += area * weight;
        }
        new_point /= weight_sum;

        int vertex_index = (*v_it).idx();
        TriMesh::VertexHandle vh = temp_mesh.vertex_handle(vertex_index);
        temp_mesh.set_point(vh, new_point);
    }

    mollified_normals.resize(mesh.n_faces());
    temp_mesh.request_face_normals();
    temp_mesh.update_face_normals();
    for(TriMesh::FaceIter f_it = temp_mesh.faces_begin(); f_it != temp_mesh.faces_end(); f_it++)
        mollified_normals[(*f_it).idx()] = temp_mesh.normal(*f_it);
}